

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::InsertCompileDefinition(cmTarget *this,cmValueWithOrigin *entry)

{
  cmTargetInternals *pcVar1;
  cmGeneratorExpression cVar2;
  cmCompiledGeneratorExpression *x;
  undefined8 *puVar3;
  cmGeneratorExpression local_38;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_28;
  TargetPropertyEntry *local_20;
  
  cmGeneratorExpression::cmGeneratorExpression(&ge,&entry->Backtrace);
  pcVar1 = (this->Internal).Pointer;
  puVar3 = (undefined8 *)operator_new(0x10);
  cmGeneratorExpression::Parse(&local_38,(string *)&ge);
  cVar2.Backtrace = local_38.Backtrace;
  local_38.Backtrace = (cmListFileBacktrace *)0x0;
  local_28.x_ = (cmCompiledGeneratorExpression *)0x0;
  *puVar3 = cVar2.Backtrace;
  puVar3[1] = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
  local_20 = (TargetPropertyEntry *)puVar3;
  std::
  vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
  ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
            ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
              *)&pcVar1->CompileDefinitionsEntries,&local_20);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_28);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_38);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTarget::InsertCompileDefinition(const cmValueWithOrigin &entry)
{
  cmGeneratorExpression ge(&entry.Backtrace);

  this->Internal->CompileDefinitionsEntries.push_back(
      new cmTargetInternals::TargetPropertyEntry(ge.Parse(entry.Value)));
}